

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

QFunctionPointer __thiscall QLibrary::resolve(QLibrary *this,char *symbol)

{
  bool bVar1;
  QFunctionPointer p_Var2;
  QLibraryPrivate *in_RSI;
  char *in_RDI;
  
  bVar1 = isLoaded((QLibrary *)0x8c56c1);
  if ((!bVar1) && (bVar1 = load((QLibrary *)in_RSI), !bVar1)) {
    return (QFunctionPointer)0x0;
  }
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
            ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c56ec);
  p_Var2 = QLibraryPrivate::resolve(in_RSI,in_RDI);
  return p_Var2;
}

Assistant:

QFunctionPointer QLibrary::resolve(const char *symbol)
{
    if (!isLoaded() && !load())
        return nullptr;
    return d->resolve(symbol);
}